

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

void gauden_accum_param_full
               (vector_t ****out,vector_t ****in,uint32 n_mgau,uint32 n_feat,uint32 n_density,
               uint32 *veclen)

{
  vector_t *ppfVar1;
  vector_t *ppfVar2;
  vector_t pfVar3;
  vector_t pfVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (n_mgau != 0) {
    uVar8 = 0;
    do {
      if (n_feat != 0) {
        uVar6 = 0;
        do {
          if (n_density != 0) {
            uVar9 = (ulong)veclen[uVar6];
            uVar10 = 0;
            do {
              if (uVar9 != 0) {
                ppfVar1 = in[uVar8][uVar6][uVar10];
                ppfVar2 = out[uVar8][uVar6][uVar10];
                uVar7 = 0;
                do {
                  pfVar3 = ppfVar1[uVar7];
                  pfVar4 = ppfVar2[uVar7];
                  uVar5 = 0;
                  do {
                    pfVar4[uVar5] = pfVar3[uVar5] + pfVar4[uVar5];
                    uVar5 = uVar5 + 1;
                  } while (uVar9 != uVar5);
                  uVar7 = uVar7 + 1;
                } while (uVar7 != uVar9);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != n_density);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != n_feat);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != n_mgau);
  }
  return;
}

Assistant:

void
gauden_accum_param_full(vector_t ****out,
			vector_t ****in,
			uint32 n_mgau,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen)
{
    uint32 i, j, k, l, ll;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    for (ll = 0; ll < veclen[j]; ll++) {
			out[i][j][k][l][ll] += in[i][j][k][l][ll];
		    }
		}
	    }
	}
    }
}